

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_QPDFTokenizer.cc
# Opt level: O1

void __thiscall Pl_QPDFTokenizer::finish(Pl_QPDFTokenizer *this)

{
  TokenFilter *pTVar1;
  Pipeline *pPVar2;
  undefined4 uVar3;
  int iVar4;
  Buffer *buf;
  string *context;
  bool bVar5;
  char ch;
  string empty;
  Token token;
  BufferInputSource input;
  undefined1 local_229;
  string local_228;
  string local_208;
  undefined1 local_1e8 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d0;
  _Alloc_hider local_1c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b0;
  _Alloc_hider local_1a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_190;
  Token local_180;
  BufferInputSource local_118;
  
  Pl_Buffer::finish(&((this->m)._M_t.
                      super___uniq_ptr_impl<Pl_QPDFTokenizer::Members,_std::default_delete<Pl_QPDFTokenizer::Members>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_Pl_QPDFTokenizer::Members_*,_std::default_delete<Pl_QPDFTokenizer::Members>_>
                      .super__Head_base<0UL,_Pl_QPDFTokenizer::Members_*,_false>._M_head_impl)->buf)
  ;
  local_1e8._0_8_ = local_1e8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"tokenizer data","");
  buf = Pl_Buffer::getBuffer
                  (&((this->m)._M_t.
                     super___uniq_ptr_impl<Pl_QPDFTokenizer::Members,_std::default_delete<Pl_QPDFTokenizer::Members>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_Pl_QPDFTokenizer::Members_*,_std::default_delete<Pl_QPDFTokenizer::Members>_>
                     .super__Head_base<0UL,_Pl_QPDFTokenizer::Members_*,_false>._M_head_impl)->buf);
  BufferInputSource::BufferInputSource(&local_118,(string *)local_1e8,buf,true);
  if ((undefined1 *)local_1e8._0_8_ != local_1e8 + 0x10) {
    operator_delete((void *)local_1e8._0_8_,(ulong)(local_1e8._16_8_ + 1));
  }
  local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
  local_208._M_string_length = 0;
  local_208.field_2._M_local_buf[0] = '\0';
  do {
    context = &local_208;
    QPDFTokenizer::readToken
              ((Token *)local_1e8,
               &((this->m)._M_t.
                 super___uniq_ptr_impl<Pl_QPDFTokenizer::Members,_std::default_delete<Pl_QPDFTokenizer::Members>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_Pl_QPDFTokenizer::Members_*,_std::default_delete<Pl_QPDFTokenizer::Members>_>
                 .super__Head_base<0UL,_Pl_QPDFTokenizer::Members_*,_false>._M_head_impl)->tokenizer
               ,&local_118.super_InputSource,context,true,0);
    (**(code **)((long)((this->m)._M_t.
                        super___uniq_ptr_impl<Pl_QPDFTokenizer::Members,_std::default_delete<Pl_QPDFTokenizer::Members>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_Pl_QPDFTokenizer::Members_*,_std::default_delete<Pl_QPDFTokenizer::Members>_>
                        .super__Head_base<0UL,_Pl_QPDFTokenizer::Members_*,_false>._M_head_impl)->
                       filter->_vptr_TokenFilter + 0x10))();
    uVar3 = local_1e8._0_4_;
    if (local_1e8._0_4_ != tt_eof) {
      local_180._0_8_ = (long)&local_180 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_180,"ID","");
      if ((local_1e8._0_4_ == tt_word) &&
         ((pointer)local_1e8._16_8_ == local_180.value._M_dataplus._M_p)) {
        if ((undefined1 *)local_1e8._16_8_ == (undefined1 *)0x0) {
          bVar5 = true;
        }
        else {
          iVar4 = bcmp((void *)local_1e8._8_8_,(void *)local_180._0_8_,local_1e8._16_8_);
          bVar5 = iVar4 == 0;
        }
      }
      else {
        bVar5 = false;
      }
      if ((void *)local_180._0_8_ != (void *)((long)&local_180 + 0x10U)) {
        operator_delete((void *)local_180._0_8_,local_180.value._M_string_length + 1);
      }
      if (bVar5) {
        local_229 = 0x20;
        BufferInputSource::read(&local_118,(int)&local_229,(void *)0x1,(size_t)context);
        pTVar1 = ((this->m)._M_t.
                  super___uniq_ptr_impl<Pl_QPDFTokenizer::Members,_std::default_delete<Pl_QPDFTokenizer::Members>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_Pl_QPDFTokenizer::Members_*,_std::default_delete<Pl_QPDFTokenizer::Members>_>
                  .super__Head_base<0UL,_Pl_QPDFTokenizer::Members_*,_false>._M_head_impl)->filter;
        local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
        std::__cxx11::string::_M_construct((ulong)&local_228,'\x01');
        QPDFTokenizer::Token::Token(&local_180,tt_space,&local_228);
        (**(code **)((long)pTVar1->_vptr_TokenFilter + 0x10))(pTVar1,&local_180);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_180.error_message._M_dataplus._M_p != &local_180.error_message.field_2) {
          operator_delete(local_180.error_message._M_dataplus._M_p,
                          local_180.error_message.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_180.raw_value._M_dataplus._M_p != &local_180.raw_value.field_2) {
          operator_delete(local_180.raw_value._M_dataplus._M_p,
                          local_180.raw_value.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_180.value._M_dataplus._M_p != &local_180.value.field_2) {
          operator_delete(local_180.value._M_dataplus._M_p,
                          local_180.value.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_228._M_dataplus._M_p != &local_228.field_2) {
          operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
        }
        QPDFTokenizer::expectInlineImage
                  (&((this->m)._M_t.
                     super___uniq_ptr_impl<Pl_QPDFTokenizer::Members,_std::default_delete<Pl_QPDFTokenizer::Members>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_Pl_QPDFTokenizer::Members_*,_std::default_delete<Pl_QPDFTokenizer::Members>_>
                     .super__Head_base<0UL,_Pl_QPDFTokenizer::Members_*,_false>._M_head_impl)->
                    tokenizer,&local_118.super_InputSource);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a0._M_p != &local_190) {
      operator_delete(local_1a0._M_p,local_190._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._M_p != &local_1b0) {
      operator_delete(local_1c0._M_p,local_1b0._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._8_8_ != &local_1d0) {
      operator_delete((void *)local_1e8._8_8_,local_1d0._0_8_ + 1);
    }
  } while (uVar3 != tt_eof);
  (**(code **)((long)((this->m)._M_t.
                      super___uniq_ptr_impl<Pl_QPDFTokenizer::Members,_std::default_delete<Pl_QPDFTokenizer::Members>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_Pl_QPDFTokenizer::Members_*,_std::default_delete<Pl_QPDFTokenizer::Members>_>
                      .super__Head_base<0UL,_Pl_QPDFTokenizer::Members_*,_false>._M_head_impl)->
                     filter->_vptr_TokenFilter + 0x18))();
  QPDFObjectHandle::TokenFilter::setPipeline
            (((this->m)._M_t.
              super___uniq_ptr_impl<Pl_QPDFTokenizer::Members,_std::default_delete<Pl_QPDFTokenizer::Members>_>
              ._M_t.
              super__Tuple_impl<0UL,_Pl_QPDFTokenizer::Members_*,_std::default_delete<Pl_QPDFTokenizer::Members>_>
              .super__Head_base<0UL,_Pl_QPDFTokenizer::Members_*,_false>._M_head_impl)->filter,
             (Pipeline *)0x0);
  pPVar2 = (this->super_Pipeline).next_;
  if (pPVar2 != (Pipeline *)0x0) {
    (*pPVar2->_vptr_Pipeline[3])();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p,
                    CONCAT71(local_208.field_2._M_allocated_capacity._1_7_,
                             local_208.field_2._M_local_buf[0]) + 1);
  }
  BufferInputSource::~BufferInputSource(&local_118);
  return;
}

Assistant:

void
Pl_QPDFTokenizer::finish()
{
    m->buf.finish();
    auto input = BufferInputSource("tokenizer data", m->buf.getBuffer(), true);
    std::string empty;
    while (true) {
        auto token = m->tokenizer.readToken(input, empty, true);
        m->filter->handleToken(token);
        if (token.getType() == QPDFTokenizer::tt_eof) {
            break;
        } else if (token.isWord("ID")) {
            // Read the space after the ID.
            char ch = ' ';
            input.read(&ch, 1);
            m->filter->handleToken(
                // line-break
                QPDFTokenizer::Token(QPDFTokenizer::tt_space, std::string(1, ch)));
            QTC::TC("qpdf", "Pl_QPDFTokenizer found ID");
            m->tokenizer.expectInlineImage(input);
        }
    }
    m->filter->handleEOF();
    QPDFObjectHandle::TokenFilter::PipelineAccessor::setPipeline(m->filter, nullptr);
    if (next()) {
        next()->finish();
    }
}